

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptArray::BigIndex::DeleteItem(BigIndex *this,JavascriptArray *arr)

{
  ScriptContext *pSVar1;
  bool bVar2;
  uint uVar3;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  JavascriptArray *arr_local;
  BigIndex *this_local;
  
  scriptContext = (ScriptContext *)arr;
  arr_local = (JavascriptArray *)this;
  bVar2 = IsSmallIndex(this);
  if (bVar2) {
    this_local._4_4_ =
         IndexTrace<unsigned_int>::DeleteItem((JavascriptArray *)scriptContext,&this->index);
  }
  else {
    propertyRecord =
         (PropertyRecord *)RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
    Js::JavascriptOperators::GetPropertyIdForInt
              (this->bigIndex,(ScriptContext *)propertyRecord,&local_30);
    pSVar1 = scriptContext;
    uVar3 = PropertyRecord::GetPropertyId(local_30);
    this_local._4_4_ =
         (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x21])(pSVar1,(ulong)uVar3,0);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::BigIndex::DeleteItem(JavascriptArray* arr) const
    {
        if (IsSmallIndex())
        {
            return small_index::DeleteItem(arr, index);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            return arr->DeleteProperty(propertyRecord->GetPropertyId(), PropertyOperation_None);
        }
    }